

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O3

void re2::Prefilter::SimplifyStringSet(SSet *ss)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  const_iterator __position;
  long lVar3;
  _Base_ptr p_Var4;
  
  p_Var2 = (ss->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(ss->_M_t)._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var2[1]._M_parent == (_Base_ptr)0x0)) {
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  for (; (_Rb_tree_header *)p_Var2 != p_Var1;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    while ((_Rb_tree_header *)__position._M_node != p_Var1) {
      if ((p_Var2[1]._M_parent < __position._M_node[1]._M_parent) &&
         (lVar3 = std::__cxx11::string::find
                            ((char *)(__position._M_node + 1),*(ulong *)(p_Var2 + 1),0), lVar3 != -1
         )) {
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_re2::Prefilter::LengthThenLex,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux(&ss->_M_t,__position);
        __position._M_node = p_Var4;
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    }
  }
  return;
}

Assistant:

void Prefilter::SimplifyStringSet(SSet* ss) {
  // Now make sure that the strings aren't redundant.  For example, if
  // we know "ab" is a required string, then it doesn't help at all to
  // know that "abc" is also a required string, so delete "abc". This
  // is because, when we are performing a string search to filter
  // regexps, matching "ab" will already allow this regexp to be a
  // candidate for match, so further matching "abc" is redundant.
  // Note that we must ignore "" because find() would find it at the
  // start of everything and thus we would end up erasing everything.
  //
  // The SSet sorts strings by length, then lexicographically. Note that
  // smaller strings appear first and all strings must be unique. These
  // observations let us skip string comparisons when possible.
  SSIter i = ss->begin();
  if (i != ss->end() && i->empty()) {
    ++i;
  }
  for (; i != ss->end(); ++i) {
    SSIter j = i;
    ++j;
    while (j != ss->end()) {
      if (j->size() > i->size() && j->find(*i) != std::string::npos) {
        j = ss->erase(j);
        continue;
      }
      ++j;
    }
  }
}